

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::setGeometry_sys(QWidgetPrivate *this,int x,int y,int w,int h,bool isMove)

{
  undefined1 *puVar1;
  undefined4 uVar2;
  QWidget *this_00;
  QWExtra *pQVar3;
  undefined4 uVar5;
  QWidgetData *pQVar4;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  char cVar12;
  uint uVar13;
  QWidgetPrivate *d;
  QWindow *pQVar14;
  QTLWExtra *pQVar15;
  QPoint QVar16;
  QPoint QVar17;
  QRect *pQVar18;
  QWidget *parent;
  int iVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  long in_FS_OFFSET;
  QRegion updateRegion;
  QPoint local_68;
  QSize local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  QWidget *pQStack_48;
  undefined1 *puStack_40;
  long local_38;
  
  uVar22 = (ulong)(uint)w;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar3 != (QWExtra *)0x0) {
    if (pQVar3->maxw < w) {
      w = pQVar3->maxw;
    }
    if (pQVar3->maxh < h) {
      h = pQVar3->maxh;
    }
    if (w <= pQVar3->minw) {
      w = pQVar3->minw;
    }
    uVar22 = (ulong)(uint)w;
    if (h <= pQVar3->minh) {
      h = pQVar3->minh;
    }
  }
  if (((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
      (pQVar14 = QWidget::windowHandle(this_00), pQVar14 != (QWindow *)0x0)) &&
     (cVar12 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0x10))
                         (QGuiApplicationPrivate::platform_integration,10), cVar12 == '\0')) {
    pQVar14 = QWidget::windowHandle(this_00);
    uVar13 = QWindow::width(pQVar14);
    uVar22 = (ulong)uVar13;
    pQVar14 = QWidget::windowHandle(this_00);
    h = QWindow::height(pQVar14);
    y = 0;
    x = 0;
  }
  uVar2 = (this_00->data->crect).x1;
  uVar5 = (this_00->data->crect).y1;
  local_60 = QWidget::size(this_00);
  iVar21 = (int)uVar22;
  bVar6 = h != local_60.ht.m_i.m_i;
  bVar7 = iVar21 != local_60.wd.m_i.m_i;
  bVar8 = y != uVar5;
  bVar9 = x != uVar2;
  bVar10 = isMove || (bVar8 || bVar9);
  if (((iVar21 == local_60.wd.m_i.m_i) && (h == local_60.ht.m_i.m_i)) && (uVar5 == y && x == uVar2))
  goto LAB_002fc367;
  iVar19 = iVar21 + x + -1;
  iVar20 = h + y + -1;
  if (((this->data).field_0x11 & 8) == 0) {
    puVar1 = &this_00->data->field_0x10;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffd;
    puVar1 = &this_00->data->field_0x10;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffb;
    if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      pQVar15 = topData(this);
      (pQVar15->normalGeometry).x1 = 0;
      (pQVar15->normalGeometry).y1 = 0;
      (pQVar15->normalGeometry).x2 = -2;
      (pQVar15->normalGeometry).y2 = -2;
    }
  }
  QVar16 = QWidget::pos(this_00);
  (this->data).crect.x1 = (Representation)x;
  (this->data).crect.y1 = (Representation)y;
  (this->data).crect.x2.m_i = iVar19;
  (this->data).crect.y2.m_i = iVar20;
  local_68 = QVar16;
  if ((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
     (pQVar14 = QWidget::windowHandle(this_00), pQVar14 == (QWindow *)0x0)) {
LAB_002fc01b:
    bVar11 = false;
  }
  else {
    if ((((this->data).field_0x10 & 4) == 0) && ((iVar21 == 0 || (h == 0)))) {
      QWidget::setAttribute(this_00,WA_OutsideWSRange,true);
      if ((this_00->data->widget_attributes & 0x8000) != 0) {
        hide_sys(this);
      }
      (this->data).crect.x1.m_i = x;
      (this->data).crect.y1.m_i = y;
      (this->data).crect.x2.m_i = iVar19;
      (this->data).crect.y2.m_i = iVar20;
      goto LAB_002fc01b;
    }
    if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x242) & 2) == 0) {
      bVar11 = false;
    }
    else {
      QWidget::setAttribute(this_00,WA_OutsideWSRange,false);
      bVar11 = true;
    }
  }
  pQVar4 = this_00->data;
  if ((pQVar4->widget_attributes & 0x8000) == 0) {
    if ((bVar10) && (QVar17 = QWidget::pos(this_00), QVar16 != QVar17)) {
      QWidget::setAttribute(this_00,WA_PendingMoveEvent,true);
    }
    if (bVar6 || bVar7) {
      QWidget::setAttribute(this_00,WA_PendingResizeEvent,true);
    }
  }
  else {
    if (((*(byte *)(*(long *)&this_00->field_0x8 + 0x248) & 0x80) == 0) &&
       ((*(byte *)(*(long *)&this_00->field_0x8 + 0x242) & 2) == 0)) {
      pQVar18 = (QRect *)QWidget::windowHandle(this_00);
      if (pQVar18 != (QRect *)0x0) {
        if (((pQVar4->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
          parent = QWidget::nativeParentWidget(this_00);
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          local_58 = (undefined1  [8])QWidget::mapTo(this_00,parent,(QPoint *)local_58);
          uStack_50 = (undefined1 *)CONCAT44((h - 1U) + local_58._4_4_,iVar21 + -1 + local_58._0_4_)
          ;
LAB_002fc0f6:
          QWindow::setGeometry(pQVar18);
        }
        else if ((bVar6 || bVar7) && (!isMove && (!bVar8 && !bVar9))) {
          QWindow::resize((int)pQVar18,iVar21);
        }
        else {
          if (!isMove && (!bVar8 && !bVar9) || (bVar6 || bVar7)) goto LAB_002fc0f6;
          QWindow::setPosition((int)pQVar18,x);
        }
        if (bVar11) {
          show_sys(this);
        }
      }
      if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        if ((this->field_0x253 & 1) == 0) {
          if (bVar10 && (!bVar6 && !bVar7)) {
            uStack_50 = (undefined1 *)
                        CONCAT44(local_60.ht.m_i.m_i + local_68.yp.m_i.m_i + -1,
                                 local_60.wd.m_i.m_i + local_68.xp.m_i.m_i + -1);
            local_58._0_4_ = local_68.xp.m_i;
            local_58._4_4_ = local_68.yp.m_i;
            moveRect(this,(QRect *)local_58,x - local_68.xp.m_i,y - local_68.yp.m_i);
          }
          else {
            invalidateBackingStore_resizeHelper(this,&local_68,&local_60);
          }
        }
        else {
          updateRegion.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion(&updateRegion,&this_00->data->crect,Rectangle);
          uStack_50 = (undefined1 *)
                      CONCAT44(local_60.ht.m_i.m_i + local_68.yp.m_i.m_i + -1,
                               local_60.wd.m_i.m_i + local_68.xp.m_i.m_i + -1);
          local_58._0_4_ = local_68.xp.m_i;
          local_58._4_4_ = local_68.yp.m_i;
          QRegion::operator+=(&updateRegion,(QRect *)local_58);
          invalidateBackingStore<QRegion>
                    (*(QWidgetPrivate **)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8),
                     &updateRegion);
          QRegion::~QRegion(&updateRegion);
        }
      }
    }
    if (bVar10) {
      pQStack_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      updateRegion.d = (QRegionData *)QWidget::pos(this_00);
      QMoveEvent::QMoveEvent((QMoveEvent *)local_58,(QPoint *)&updateRegion,&local_68);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)local_58);
      QMoveEvent::~QMoveEvent((QMoveEvent *)local_58);
    }
    if (bVar6 || bVar7) {
      updateRegion.d = (QRegionData *)(uVar22 | (ulong)(uint)h << 0x20);
      pQStack_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QResizeEvent::QResizeEvent((QResizeEvent *)local_58,(QSize *)&updateRegion,&local_60);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)local_58);
      pQVar14 = QWidget::windowHandle(this_00);
      if (pQVar14 != (QWindow *)0x0) {
        QWidget::update(this_00);
      }
      QResizeEvent::~QResizeEvent((QResizeEvent *)local_58);
    }
  }
  cVar12 = QAccessible::isActive();
  if ((cVar12 != '\0') && ((this_00->data->widget_attributes & 0x8000) != 0)) {
    local_58 = (undefined1  [8])QFont::strikeOut;
    uStack_50 = (undefined1 *)0xaaaaaaaa0000800b;
    puStack_40 = (undefined1 *)0xaaaaaaaaffffffff;
    pQStack_48 = this_00;
    QAccessible::updateAccessibility((QAccessibleEvent *)local_58);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)local_58);
  }
LAB_002fc367:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setGeometry_sys(int x, int y, int w, int h, bool isMove)
{
    Q_Q(QWidget);
    if (extra) {                                // any size restrictions?
        w = qMin(w,extra->maxw);
        h = qMin(h,extra->maxh);
        w = qMax(w,extra->minw);
        h = qMax(h,extra->minh);
    }

    if (q->isWindow() && q->windowHandle()) {
        QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
        if (!integration->hasCapability(QPlatformIntegration::NonFullScreenWindows)) {
            x = 0;
            y = 0;
            w = q->windowHandle()->width();
            h = q->windowHandle()->height();
        }
    }

    QPoint oldp = q->geometry().topLeft();
    QSize olds = q->size();
    QRect r(x, y, w, h);

    bool isResize = olds != r.size();
    if (!isMove)
        isMove = oldp != r.topLeft();


    // We only care about stuff that changes the geometry, or may
    // cause the window manager to change its state
    if (r.size() == olds && oldp == r.topLeft())
        return;

    if (!data.in_set_window_state) {
        q->data->window_state &= ~Qt::WindowMaximized;
        q->data->window_state &= ~Qt::WindowFullScreen;
        if (q->isWindow())
            topData()->normalGeometry = QRect(0, 0, -1, -1);
    }

    QPoint oldPos = q->pos();
    data.crect = r;

    bool needsShow = false;

    if (q->isWindow() || q->windowHandle()) {
        if (!(data.window_state & Qt::WindowFullScreen) && (w == 0 || h == 0)) {
            q->setAttribute(Qt::WA_OutsideWSRange, true);
            if (q->isVisible())
                hide_sys();
            data.crect = QRect(x, y, w, h);
        } else if (q->testAttribute(Qt::WA_OutsideWSRange)) {
            q->setAttribute(Qt::WA_OutsideWSRange, false);
            needsShow = true;
        }
    }

    if (q->isVisible()) {
        if (!q->testAttribute(Qt::WA_DontShowOnScreen) && !q->testAttribute(Qt::WA_OutsideWSRange)) {
            if (QWindow *win = q->windowHandle()) {
                if (q->isWindow()) {
                    if (isResize && !isMove)
                        win->resize(w, h);
                    else if (isMove && !isResize)
                        win->setPosition(x, y);
                    else
                        win->setGeometry(q->geometry());
                } else {
                    QPoint posInNativeParent =  q->mapTo(q->nativeParentWidget(),QPoint());
                    win->setGeometry(QRect(posInNativeParent,r.size()));
                }

                if (needsShow)
                    show_sys();
            }

            if (!q->isWindow()) {
                if (renderToTexture) {
                    QRegion updateRegion(q->geometry());
                    updateRegion += QRect(oldPos, olds);
                    q->parentWidget()->d_func()->invalidateBackingStore(updateRegion);
                } else if (isMove && !isResize) {
                    moveRect(QRect(oldPos, olds), x - oldPos.x(), y - oldPos.y());
                } else {
                    invalidateBackingStore_resizeHelper(oldPos, olds);
                }
            }
        }

        if (isMove) {
            QMoveEvent e(q->pos(), oldPos);
            QCoreApplication::sendEvent(q, &e);
        }
        if (isResize) {
            QResizeEvent e(r.size(), olds);
            QCoreApplication::sendEvent(q, &e);
            if (q->windowHandle())
                q->update();
        }
    } else { // not visible
        if (isMove && q->pos() != oldPos)
            q->setAttribute(Qt::WA_PendingMoveEvent, true);
        if (isResize)
            q->setAttribute(Qt::WA_PendingResizeEvent, true);
    }

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive() && q->isVisible()) {
        QAccessibleEvent event(q, QAccessible::LocationChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif
}